

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeFunctionCall(ExpressionContext *ctx,SynFunctionCall *syntax)

{
  InplaceStr *pIVar1;
  SynBase *pSVar2;
  Allocator *pAVar3;
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  IntrusiveList<TypeHandle> generics_02;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  IntrusiveList<ExprBase> arguments_03;
  IntrusiveList<ExprBase> arguments_04;
  IntrusiveList<ExprBase> arguments_05;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ExprFunctionCall *this;
  TypeBase *pTVar7;
  TypeHandle *this_00;
  ExprTypeLiteral *pEVar8;
  ExprBase *pEVar9;
  FunctionValue *pFVar10;
  ExprVariableDefinition *this_01;
  VariableHandle *this_02;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<FunctionValue> functions_02;
  ArrayView<FunctionValue> functions_03;
  ArrayView<FunctionValue> functions_04;
  ArrayView<FunctionValue> functions_05;
  ArrayView<ArgumentData> local_938;
  SynBase *local_928;
  TypeHandle *pTStack_920;
  undefined1 local_910 [12];
  undefined1 local_900 [12];
  ArrayView<ExprBase*> local_8f0 [16];
  ExprBase *local_8e0;
  undefined1 local_8d8 [8];
  SmallArray<ExprBase_*,_3U> expressions_1;
  undefined8 uStack_8a0;
  undefined1 local_880 [12];
  ExprBase *local_870;
  ExprBase *call_1;
  undefined4 local_860;
  ArrayView<ExprBase*> local_858 [16];
  ExprBase *local_848;
  undefined1 local_840 [8];
  SmallArray<ExprBase_*,_2U> expressions;
  ExprBase *constructor;
  ExprBase *definition;
  ExprBase *pointer;
  VariableData *variable;
  uint uStack_7f0;
  undefined4 uStack_7ec;
  SynBase *local_7e8;
  TypeHandle *pTStack_7e0;
  undefined1 local_7d8 [12];
  ExpressionContext *local_7c8;
  ExprBase *call;
  undefined4 local_7b8;
  uint local_7b0;
  byte local_7a9;
  uint i;
  bool hasReturnValue;
  char *pcStack_7a0;
  IntrusiveList<SynIdentifier> local_798;
  char *local_788;
  char *pcStack_780;
  IntrusiveList<SynIdentifier> local_778;
  char *local_768;
  char *pcStack_760;
  SynIdentifier *local_758;
  SynIdentifier *pSStack_750;
  SynTypeSimple *local_740;
  SynTypeSimple *node;
  ExprBase *regular;
  MemberHandle *curr_1;
  SynTypeSimple *name;
  TypeMemberSet *memberSet;
  ExprBase *pEStack_710;
  SynCallArgument *local_708;
  SynCallArgument *el_2;
  IntrusiveList<ExprBase> arguments_3;
  SynCallArgument *local_6d8;
  SynCallArgument *el_1;
  IntrusiveList<ExprBase> arguments_2;
  TypeClass *typeClass;
  ExprTypeLiteral *type_1;
  undefined1 local_6a0 [8];
  SmallArray<ArgumentData,_16U> arguments;
  SmallArray<FunctionValue,_32U> functions;
  TypeBase *type;
  SynBase *curr;
  IntrusiveList<TypeHandle> generics;
  SynCallArgument *local_40;
  SynCallArgument *el;
  IntrusiveList<ExprBase> arguments_1;
  ExprBase *function;
  SynFunctionCall *syntax_local;
  ExpressionContext *ctx_local;
  
  arguments_1.tail = AnalyzeExpression(ctx,syntax->value);
  bVar4 = isType<TypeError>((arguments_1.tail)->type);
  if (bVar4) {
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&el);
    for (local_40 = (syntax->arguments).head; local_40 != (SynCallArgument *)0x0;
        local_40 = getType<SynCallArgument>((local_40->super_SynBase).next)) {
      pEVar9 = AnalyzeExpression(ctx,local_40->value);
      IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&el,pEVar9);
    }
    this = ExpressionContext::get<ExprFunctionCall>(ctx);
    pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    generics.tail = (TypeHandle *)el;
    arguments_05.tail = arguments_1.head;
    arguments_05.head = (ExprBase *)el;
    ExprFunctionCall::ExprFunctionCall
              (this,&syntax->super_SynBase,pTVar7,arguments_1.tail,arguments_05);
    return &this->super_ExprBase;
  }
  IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&curr);
  for (type = (TypeBase *)(syntax->aliases).head; type != (TypeBase *)0x0;
      type = (TypeBase *)type->size) {
    pTVar7 = AnalyzeType(ctx,(SynBase *)type,true,(bool *)0x0);
    if (pTVar7 == ctx->typeAuto) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,&syntax->super_SynBase,"ERROR: explicit generic argument type can\'t be auto");
    }
    if (pTVar7 == ctx->typeVoid) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,&syntax->super_SynBase,"ERROR: explicit generic argument cannot be a void type"
                );
    }
    this_00 = ExpressionContext::get<TypeHandle>(ctx);
    TypeHandle::TypeHandle(this_00,pTVar7);
    IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&curr,this_00);
  }
  SmallArray<FunctionValue,_32U>::SmallArray
            ((SmallArray<FunctionValue,_32U> *)&arguments.allocator,ctx->allocator);
  SmallArray<ArgumentData,_16U>::SmallArray
            ((SmallArray<ArgumentData,_16U> *)local_6a0,ctx->allocator);
  pEVar8 = getType<ExprTypeLiteral>(arguments_1.tail);
  if (pEVar8 != (ExprTypeLiteral *)0x0) {
    arguments_2.tail = (ExprBase *)getType<TypeClass>(pEVar8->value);
    if (((TypeClass *)arguments_2.tail != (TypeClass *)0x0) &&
       ((((TypeClass *)arguments_2.tail)->completed & 1U) == 0)) {
      anon_unknown.dwarf_e7629::Report
                (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not fully defined",
                 (ulong)(uint)(*(int *)&(((TypeClass *)arguments_2.tail)->super_TypeStruct).
                                        super_TypeBase.name.end -
                              (int)(((TypeClass *)arguments_2.tail)->super_TypeStruct).
                                   super_TypeBase.name.begin));
      IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&el_1);
      for (local_6d8 = (syntax->arguments).head; local_6d8 != (SynCallArgument *)0x0;
          local_6d8 = getType<SynCallArgument>((local_6d8->super_SynBase).next)) {
        pEVar9 = AnalyzeExpression(ctx,local_6d8->value);
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&el_1,pEVar9);
      }
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprFunctionCall>(ctx);
      pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      arguments_04.tail = arguments_2.head;
      arguments_04.head = (ExprBase *)el_1;
      ExprFunctionCall::ExprFunctionCall
                ((ExprFunctionCall *)ctx_local,&syntax->super_SynBase,pTVar7,arguments_1.tail,
                 arguments_04);
      arguments_3.tail._4_4_ = 1;
      goto LAB_0024ea4f;
    }
    bVar4 = isType<TypeError>(pEVar8->value);
    if (bVar4) {
      IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&el_2);
      for (local_708 = (syntax->arguments).head; local_708 != (SynCallArgument *)0x0;
          local_708 = getType<SynCallArgument>((local_708->super_SynBase).next)) {
        pEVar9 = AnalyzeExpression(ctx,local_708->value);
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&el_2,pEVar9);
      }
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprFunctionCall>(ctx);
      pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      memberSet = (TypeMemberSet *)el_2;
      pEStack_710 = arguments_3.head;
      arguments_03.tail = arguments_3.head;
      arguments_03.head = (ExprBase *)el_2;
      ExprFunctionCall::ExprFunctionCall
                ((ExprFunctionCall *)ctx_local,&syntax->super_SynBase,pTVar7,arguments_1.tail,
                 arguments_03);
      arguments_3.tail._4_4_ = 1;
      goto LAB_0024ea4f;
    }
    name = (SynTypeSimple *)getType<TypeMemberSet>(pEVar8->value);
    if ((((((TypeMemberSet *)name != (TypeMemberSet *)0x0) &&
          (bVar4 = IntrusiveList<TypeHandle>::empty((IntrusiveList<TypeHandle> *)&curr), bVar4)) &&
         (uVar5 = IntrusiveList<SynCallArgument>::size(&syntax->arguments), uVar5 == 1)) &&
        ((((syntax->arguments).head)->name == (SynIdentifier *)0x0 &&
         (curr_1 = (MemberHandle *)getType<SynTypeSimple>(((syntax->arguments).head)->value),
         (SynTypeSimple *)curr_1 != (SynTypeSimple *)0x0)))) &&
       (bVar4 = IntrusiveList<SynIdentifier>::empty(&((SynTypeSimple *)curr_1)->path), bVar4)) {
      for (regular = (ExprBase *)name[1].super_SynBase._vptr_SynBase[0xd];
          regular != (ExprBase *)0x0; regular = (ExprBase *)regular->type) {
        bVar4 = InplaceStr::operator==
                          ((InplaceStr *)(*(long *)(*(long *)&regular->typeID + 0x28) + 0x40),
                           (InplaceStr *)(curr_1 + 2));
        if (bVar4) {
          ctx_local = (ExpressionContext *)ExpressionContext::get<ExprBoolLiteral>(ctx);
          ExprBoolLiteral::ExprBoolLiteral
                    ((ExprBoolLiteral *)ctx_local,&syntax->super_SynBase,ctx->typeBool,true);
          arguments_3.tail._4_4_ = 1;
          goto LAB_0024ea4f;
        }
      }
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprBoolLiteral>(ctx);
      ExprBoolLiteral::ExprBoolLiteral
                ((ExprBoolLiteral *)ctx_local,&syntax->super_SynBase,ctx->typeBool,false);
      arguments_3.tail._4_4_ = 1;
      goto LAB_0024ea4f;
    }
    node = (SynTypeSimple *)0x0;
    local_740 = getType<SynTypeSimple>(syntax->value);
    if (local_740 == (SynTypeSimple *)0x0) {
      pSVar2 = syntax->value;
      IntrusiveList<SynIdentifier>::IntrusiveList(&local_798);
      pIVar1 = &pEVar8->value->name;
      _i = pIVar1->begin;
      pcStack_7a0 = (pEVar8->value->name).end;
      node = (SynTypeSimple *)CreateVariableAccess(ctx,pSVar2,local_798,*pIVar1,false);
    }
    else {
      local_758 = (local_740->path).head;
      pSStack_750 = (local_740->path).tail;
      local_768 = (local_740->name).begin;
      pcStack_760 = (local_740->name).end;
      node = (SynTypeSimple *)
             CreateVariableAccess(ctx,syntax->value,local_740->path,local_740->name,false);
      if ((node == (SynTypeSimple *)0x0) &&
         (bVar4 = IntrusiveList<SynIdentifier>::empty(&local_740->path), bVar4)) {
        pSVar2 = syntax->value;
        IntrusiveList<SynIdentifier>::IntrusiveList(&local_778);
        pIVar1 = &pEVar8->value->name;
        local_788 = pIVar1->begin;
        pcStack_780 = (pEVar8->value->name).end;
        node = (SynTypeSimple *)CreateVariableAccess(ctx,pSVar2,local_778,*pIVar1,false);
      }
    }
    if (node != (SynTypeSimple *)0x0) {
      SmallArray<FunctionValue,_32U>::clear((SmallArray<FunctionValue,_32U> *)&arguments.allocator);
      GetNodeFunctions(ctx,&syntax->super_SynBase,(ExprBase *)node,
                       (SmallArray<FunctionValue,_32U> *)&arguments.allocator);
      local_7a9 = 0;
      for (local_7b0 = 0; uVar5 = local_7b0,
          uVar6 = SmallArray<FunctionValue,_32U>::size
                            ((SmallArray<FunctionValue,_32U> *)&arguments.allocator), uVar5 < uVar6;
          local_7b0 = local_7b0 + 1) {
        pFVar10 = SmallArray<FunctionValue,_32U>::operator[]
                            ((SmallArray<FunctionValue,_32U> *)&arguments.allocator,local_7b0);
        if (pFVar10->function->type->returnType != ctx->typeVoid) {
          local_7a9 = 1;
          break;
        }
      }
      if ((local_7a9 & 1) != 0) {
        bVar4 = SmallArray<ArgumentData,_16U>::empty((SmallArray<ArgumentData,_16U> *)local_6a0);
        if (bVar4) {
          AnalyzeFunctionArgumentsEarly
                    (ctx,(syntax->arguments).head,(SmallArray<ArgumentData,_16U> *)local_6a0);
        }
        pEVar9 = arguments_1.tail;
        ArrayView<FunctionValue>::ArrayView<32u>
                  ((ArrayView<FunctionValue> *)&call,
                   (SmallArray<FunctionValue,_32U> *)&arguments.allocator);
        functions_00._12_4_ = 0;
        functions_00.data = (FunctionValue *)call;
        functions_00.count = local_7b8;
        AnalyzeFunctionArgumentsFinal
                  (ctx,&syntax->super_SynBase,pEVar9,functions_00,(syntax->arguments).head,
                   (SmallArray<ArgumentData,_16U> *)local_6a0);
        pEVar9 = arguments_1.tail;
        ArrayView<FunctionValue>::ArrayView<32u>
                  ((ArrayView<FunctionValue> *)local_7d8,
                   (SmallArray<FunctionValue,_32U> *)&arguments.allocator);
        local_7e8 = curr;
        pTStack_7e0 = generics.head;
        ArrayView<ArgumentData>::ArrayView<16u>
                  ((ArrayView<ArgumentData> *)&variable,(SmallArray<ArgumentData,_16U> *)local_6a0);
        generics_00.tail = pTStack_7e0;
        generics_00.head = (TypeHandle *)local_7e8;
        arguments_00.count = uStack_7f0;
        arguments_00._12_4_ = uStack_7ec;
        arguments_00.data = (ArgumentData *)variable;
        functions_01._12_4_ = 0;
        functions_01.data = (FunctionValue *)local_7d8._0_8_;
        functions_01.count = local_7d8._8_4_;
        local_7c8 = (ExpressionContext *)
                    CreateFunctionCallFinal
                              (ctx,&syntax->super_SynBase,pEVar9,functions_01,generics_00,
                               arguments_00,true);
        if (local_7c8 != (ExpressionContext *)0x0) {
          arguments_3.tail._4_4_ = 1;
          ctx_local = local_7c8;
          goto LAB_0024ea4f;
        }
      }
    }
    if ((pEVar8->value->isGeneric & 1U) == 0) {
      pointer = (ExprBase *)
                anon_unknown.dwarf_e7629::AllocateTemporary
                          (ctx,&syntax->super_SynBase,pEVar8->value);
      pEVar9 = CreateVariableAccess(ctx,&syntax->super_SynBase,(VariableData *)pointer,false);
      definition = CreateGetAddress(ctx,&syntax->super_SynBase,pEVar9);
      this_01 = ExpressionContext::get<ExprVariableDefinition>(ctx);
      pTVar7 = ctx->typeVoid;
      this_02 = ExpressionContext::get<VariableHandle>(ctx);
      VariableHandle::VariableHandle(this_02,(SynBase *)0x0,(VariableData *)pointer);
      ExprVariableDefinition::ExprVariableDefinition
                (this_01,&syntax->super_SynBase,pTVar7,this_02,(ExprBase *)0x0);
      pTVar7 = pEVar8->value;
      constructor = &this_01->super_ExprBase;
      bVar4 = IntrusiveList<SynCallArgument>::empty(&syntax->arguments);
      expressions.allocator =
           (Allocator *)CreateConstructorAccess(ctx,&syntax->super_SynBase,pTVar7,bVar4,definition);
      if (((ExprBase *)expressions.allocator == (ExprBase *)0x0) &&
         (bVar4 = IntrusiveList<SynCallArgument>::empty(&syntax->arguments), bVar4)) {
        SmallArray<ExprBase_*,_2U>::SmallArray
                  ((SmallArray<ExprBase_*,_2U> *)local_840,ctx->allocator);
        SmallArray<ExprBase_*,_2U>::push_back((SmallArray<ExprBase_*,_2U> *)local_840,&constructor);
        local_848 = CreateVariableAccess(ctx,&syntax->super_SynBase,(VariableData *)pointer,false);
        SmallArray<ExprBase_*,_2U>::push_back((SmallArray<ExprBase_*,_2U> *)local_840,&local_848);
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprSequence>(ctx);
        pAVar3 = ctx->allocator;
        pTVar7 = pEVar8->value;
        ArrayView<ExprBase*>::ArrayView<2u>(local_858,(SmallArray<ExprBase_*,_2U> *)local_840);
        arr._12_4_ = 0;
        arr._0_12_ = local_858._0_12_;
        ExprSequence::ExprSequence
                  ((ExprSequence *)ctx_local,pAVar3,&syntax->super_SynBase,pTVar7,arr);
        arguments_3.tail._4_4_ = 1;
        SmallArray<ExprBase_*,_2U>::~SmallArray((SmallArray<ExprBase_*,_2U> *)local_840);
        goto LAB_0024ea4f;
      }
      if (expressions.allocator != (Allocator *)0x0) {
        SmallArray<FunctionValue,_32U>::clear
                  ((SmallArray<FunctionValue,_32U> *)&arguments.allocator);
        GetNodeFunctions(ctx,&syntax->super_SynBase,(ExprBase *)expressions.allocator,
                         (SmallArray<FunctionValue,_32U> *)&arguments.allocator);
        bVar4 = SmallArray<ArgumentData,_16U>::empty((SmallArray<ArgumentData,_16U> *)local_6a0);
        if (bVar4) {
          AnalyzeFunctionArgumentsEarly
                    (ctx,(syntax->arguments).head,(SmallArray<ArgumentData,_16U> *)local_6a0);
        }
        pEVar9 = arguments_1.tail;
        ArrayView<FunctionValue>::ArrayView<32u>
                  ((ArrayView<FunctionValue> *)&call_1,
                   (SmallArray<FunctionValue,_32U> *)&arguments.allocator);
        functions_02._12_4_ = 0;
        functions_02.data = (FunctionValue *)call_1;
        functions_02.count = local_860;
        AnalyzeFunctionArgumentsFinal
                  (ctx,&syntax->super_SynBase,pEVar9,functions_02,(syntax->arguments).head,
                   (SmallArray<ArgumentData,_16U> *)local_6a0);
        pEVar9 = arguments_1.tail;
        ArrayView<FunctionValue>::ArrayView<32u>
                  ((ArrayView<FunctionValue> *)local_880,
                   (SmallArray<FunctionValue,_32U> *)&arguments.allocator);
        ArrayView<ArgumentData>::ArrayView<16u>
                  ((ArrayView<ArgumentData> *)&expressions_1.allocator,
                   (SmallArray<ArgumentData,_16U> *)local_6a0);
        generics_01.tail = generics.head;
        generics_01.head = (TypeHandle *)curr;
        arguments_01._8_8_ = uStack_8a0;
        arguments_01.data = (ArgumentData *)expressions_1.allocator;
        functions_03._12_4_ = 0;
        functions_03.data = (FunctionValue *)local_880._0_8_;
        functions_03.count = local_880._8_4_;
        local_870 = CreateFunctionCallFinal
                              (ctx,&syntax->super_SynBase,pEVar9,functions_03,generics_01,
                               arguments_01,false);
        SmallArray<ExprBase_*,_3U>::SmallArray
                  ((SmallArray<ExprBase_*,_3U> *)local_8d8,ctx->allocator);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_8d8,&constructor);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_8d8,&local_870);
        local_8e0 = CreateVariableAccess(ctx,&syntax->super_SynBase,(VariableData *)pointer,false);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_8d8,&local_8e0);
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprSequence>(ctx);
        pAVar3 = ctx->allocator;
        pTVar7 = pEVar8->value;
        ArrayView<ExprBase*>::ArrayView<3u>(local_8f0,(SmallArray<ExprBase_*,_3U> *)local_8d8);
        arr_00._12_4_ = 0;
        arr_00._0_12_ = local_8f0._0_12_;
        ExprSequence::ExprSequence
                  ((ExprSequence *)ctx_local,pAVar3,&syntax->super_SynBase,pTVar7,arr_00);
        arguments_3.tail._4_4_ = 1;
        SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_8d8);
        goto LAB_0024ea4f;
      }
    }
  }
  SmallArray<FunctionValue,_32U>::clear((SmallArray<FunctionValue,_32U> *)&arguments.allocator);
  GetNodeFunctions(ctx,&syntax->super_SynBase,arguments_1.tail,
                   (SmallArray<FunctionValue,_32U> *)&arguments.allocator);
  bVar4 = SmallArray<ArgumentData,_16U>::empty((SmallArray<ArgumentData,_16U> *)local_6a0);
  if (bVar4) {
    AnalyzeFunctionArgumentsEarly
              (ctx,(syntax->arguments).head,(SmallArray<ArgumentData,_16U> *)local_6a0);
  }
  pEVar9 = arguments_1.tail;
  ArrayView<FunctionValue>::ArrayView<32u>
            ((ArrayView<FunctionValue> *)local_900,
             (SmallArray<FunctionValue,_32U> *)&arguments.allocator);
  functions_04._12_4_ = 0;
  functions_04.data = (FunctionValue *)local_900._0_8_;
  functions_04.count = local_900._8_4_;
  AnalyzeFunctionArgumentsFinal
            (ctx,&syntax->super_SynBase,pEVar9,functions_04,(syntax->arguments).head,
             (SmallArray<ArgumentData,_16U> *)local_6a0);
  pEVar9 = arguments_1.tail;
  ArrayView<FunctionValue>::ArrayView<32u>
            ((ArrayView<FunctionValue> *)local_910,
             (SmallArray<FunctionValue,_32U> *)&arguments.allocator);
  local_928 = curr;
  pTStack_920 = generics.head;
  ArrayView<ArgumentData>::ArrayView<16u>(&local_938,(SmallArray<ArgumentData,_16U> *)local_6a0);
  generics_02.tail = pTStack_920;
  generics_02.head = (TypeHandle *)local_928;
  arguments_02.count = local_938.count;
  arguments_02._12_4_ = local_938._12_4_;
  arguments_02.data = local_938.data;
  functions_05._12_4_ = 0;
  functions_05.data = (FunctionValue *)local_910._0_8_;
  functions_05.count = local_910._8_4_;
  ctx_local = (ExpressionContext *)
              CreateFunctionCallFinal
                        (ctx,&syntax->super_SynBase,pEVar9,functions_05,generics_02,arguments_02,
                         false);
  arguments_3.tail._4_4_ = 1;
LAB_0024ea4f:
  SmallArray<ArgumentData,_16U>::~SmallArray((SmallArray<ArgumentData,_16U> *)local_6a0);
  SmallArray<FunctionValue,_32U>::~SmallArray
            ((SmallArray<FunctionValue,_32U> *)&arguments.allocator);
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeFunctionCall(ExpressionContext &ctx, SynFunctionCall *syntax)
{
	ExprBase *function = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(function->type))
	{
		IntrusiveList<ExprBase> arguments;

		for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
			arguments.push_back(AnalyzeExpression(ctx, el->value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
	}

	IntrusiveList<TypeHandle> generics;

	for(SynBase *curr = syntax->aliases.head; curr; curr = curr->next)
	{
		TypeBase *type = AnalyzeType(ctx, curr);

		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: explicit generic argument type can't be auto");

		if(type == ctx.typeVoid)
			Stop(ctx, syntax, "ERROR: explicit generic argument cannot be a void type");

		generics.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
	}

	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);
	SmallArray<ArgumentData, 16> arguments(ctx.allocator);

	if(ExprTypeLiteral *type = getType<ExprTypeLiteral>(function))
	{
		if(TypeClass *typeClass = getType<TypeClass>(type->value))
		{
			if(!typeClass->completed)
			{
				Report(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(typeClass->name));

				IntrusiveList<ExprBase> arguments;

				for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
					arguments.push_back(AnalyzeExpression(ctx, el->value));

				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
			}
		}

		if(isType<TypeError>(type->value))
		{
			IntrusiveList<ExprBase> arguments;

			for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
				arguments.push_back(AnalyzeExpression(ctx, el->value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
		}

		// Handle hasMember(x) expresion
		if(TypeMemberSet *memberSet = getType<TypeMemberSet>(type->value))
		{
			if(generics.empty() && syntax->arguments.size() == 1 && !syntax->arguments.head->name)
			{
				if(SynTypeSimple *name = getType<SynTypeSimple>(syntax->arguments.head->value))
				{
					if(name->path.empty())
					{
						for(MemberHandle *curr = memberSet->type->members.head; curr; curr = curr->next)
						{
							if(curr->variable->name->name == name->name)
								return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(syntax, ctx.typeBool, true);
						}

						return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(syntax, ctx.typeBool, false);
					}
				}
			}
		}

		ExprBase *regular = NULL;

		if(SynTypeSimple *node = getType<SynTypeSimple>(syntax->value))
		{
			regular = CreateVariableAccess(ctx, syntax->value, node->path, node->name, false);

			if(!regular && node->path.empty())
				regular = CreateVariableAccess(ctx, syntax->value, IntrusiveList<SynIdentifier>(), type->value->name, false);
		}
		else
		{
			regular = CreateVariableAccess(ctx, syntax->value, IntrusiveList<SynIdentifier>(), type->value->name, false);
		}

		if(regular)
		{
			// Collect a set of available functions
			functions.clear();
			GetNodeFunctions(ctx, syntax, regular, functions);

			// If only constructors are available, do not call as a regular function
			bool hasReturnValue = false;

			for(unsigned i = 0; i < functions.size(); i++)
			{
				if(functions[i].function->type->returnType != ctx.typeVoid)
				{
					hasReturnValue = true;
					break;
				}
			}

			if(hasReturnValue)
			{
				if(arguments.empty())
					AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

				AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

				ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, true);

				if(call)
					return call;
			}
		}

		if(!type->value->isGeneric)
		{
			VariableData *variable = AllocateTemporary(ctx, syntax, type->value);

			ExprBase *pointer = CreateGetAddress(ctx, syntax, CreateVariableAccess(ctx, syntax, variable, false));

			ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), NULL);

			ExprBase *constructor = CreateConstructorAccess(ctx, syntax, type->value, syntax->arguments.empty(), pointer);

			if(!constructor && syntax->arguments.empty())
			{
				SmallArray<ExprBase*, 2> expressions(ctx.allocator);

				expressions.push_back(definition);
				expressions.push_back(CreateVariableAccess(ctx, syntax, variable, false));

				return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, type->value, expressions);
			}

			if(constructor)
			{
				// Collect a set of available functions
				functions.clear();
				GetNodeFunctions(ctx, syntax, constructor, functions);

				if(arguments.empty())
					AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

				AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

				ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, false);

				SmallArray<ExprBase*, 3> expressions(ctx.allocator);

				expressions.push_back(definition);
				expressions.push_back(call);
				expressions.push_back(CreateVariableAccess(ctx, syntax, variable, false));

				return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, type->value, expressions);
			}
		}
	}

	// Collect a set of available functions
	functions.clear();
	GetNodeFunctions(ctx, syntax, function, functions);

	if(arguments.empty())
		AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

	AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

	return CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, false);
}